

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TaggedInt.cpp
# Opt level: O0

int Js::TaggedInt::ToBuffer(Var aValue,char16 *buffer,uint bufSize)

{
  int32 value;
  int iVar1;
  uint bufSize_local;
  char16 *buffer_local;
  Var aValue_local;
  
  value = ToInt32(aValue);
  iVar1 = ToBuffer(value,buffer,bufSize);
  return iVar1;
}

Assistant:

int TaggedInt::ToBuffer(Var aValue, __out_ecount_z(bufSize) char16 * buffer, uint bufSize)
    {
        return ToBuffer(ToInt32(aValue), buffer, bufSize);
    }